

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kex.c
# Opt level: O0

size_t kex_method_list(uchar *buf,size_t list_strlen,LIBSSH2_COMMON_METHOD **method)

{
  size_t sVar1;
  undefined1 *puVar2;
  bool bVar3;
  LIBSSH2_COMMON_METHOD **ppLStack_28;
  int mlen;
  LIBSSH2_COMMON_METHOD **method_local;
  size_t list_strlen_local;
  uchar *buf_local;
  
  _libssh2_htonu32(buf,(uint32_t)list_strlen);
  list_strlen_local = (size_t)(buf + 4);
  if ((method == (LIBSSH2_COMMON_METHOD **)0x0) ||
     (ppLStack_28 = method, *method == (LIBSSH2_COMMON_METHOD *)0x0)) {
    buf_local = (uchar *)0x4;
  }
  else {
    while( true ) {
      bVar3 = false;
      if (*ppLStack_28 != (LIBSSH2_COMMON_METHOD *)0x0) {
        bVar3 = (*ppLStack_28)->name != (char *)0x0;
      }
      if (!bVar3) break;
      sVar1 = strlen((*ppLStack_28)->name);
      memcpy((void *)list_strlen_local,(*ppLStack_28)->name,(long)(int)sVar1);
      puVar2 = (undefined1 *)(list_strlen_local + (long)(int)sVar1);
      list_strlen_local = (size_t)(puVar2 + 1);
      *puVar2 = 0x2c;
      ppLStack_28 = ppLStack_28 + 1;
    }
    buf_local = (uchar *)(list_strlen + 4);
  }
  return (size_t)buf_local;
}

Assistant:

static size_t
kex_method_list(unsigned char *buf, size_t list_strlen,
                LIBSSH2_COMMON_METHOD ** method)
{
    _libssh2_htonu32(buf, list_strlen);
    buf += 4;

    if(!method || !*method) {
        return 4;
    }

    while(*method && (*method)->name) {
        int mlen = strlen((*method)->name);
        memcpy(buf, (*method)->name, mlen);
        buf += mlen;
        *(buf++) = ',';
        method++;
    }

    return list_strlen + 4;
}